

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMS_RSA_PARMS_Unmarshal(TPMS_RSA_PARMS *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPM_RC TVar2;
  UINT32 UVar3;
  
  TVar2 = TPMT_SYM_DEF_OBJECT_Unmarshal(&target->symmetric,buffer,size,1);
  if (TVar2 == 0) {
    TVar2 = TPMT_RSA_SCHEME_Unmarshal(&target->scheme,buffer,size,1);
    if (TVar2 == 0) {
      TVar2 = TPMI_RSA_KEY_BITS_Unmarshal(&target->keyBits,buffer,size);
      if (TVar2 == 0) {
        iVar1 = *size;
        *size = iVar1 + -4;
        TVar2 = 0x9a;
        if (3 < iVar1) {
          UVar3 = ByteArrayToUint32(*buffer);
          target->exponent = UVar3;
          *buffer = *buffer + 4;
          TVar2 = 0;
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMS_RSA_PARMS_Unmarshal(TPMS_RSA_PARMS *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMT_SYM_DEF_OBJECT_Unmarshal((TPMT_SYM_DEF_OBJECT *)&(target->symmetric), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMT_RSA_SCHEME_Unmarshal((TPMT_RSA_SCHEME *)&(target->scheme), buffer, size, 1);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_RSA_KEY_BITS_Unmarshal((TPMI_RSA_KEY_BITS *)&(target->keyBits), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT32_Unmarshal((UINT32 *)&(target->exponent), buffer, size);
    return result;
}